

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_compression.cpp
# Opt level: O1

void duckdb::DictionaryCompressionStorage::StringScanPartial<false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  CompressedStringScanState *this;
  
  this = (CompressedStringScanState *)
         unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
         operator->(&state->scan_state);
  CompressedStringScanState::ScanToFlatVector
            (this,result,result_offset,
             state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start,scan_count
            );
  return;
}

Assistant:

void DictionaryCompressionStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count,
                                                     Vector &result, idx_t result_offset) {
	// clear any previously locked buffers and get the primary buffer handle
	auto &scan_state = state.scan_state->Cast<CompressedStringScanState>();

	auto start = segment.GetRelativeIndex(state.row_index);
	if (!ALLOW_DICT_VECTORS || scan_count != STANDARD_VECTOR_SIZE ||
	    start % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE != 0) {
		scan_state.ScanToFlatVector(result, result_offset, start, scan_count);
	} else {
		scan_state.ScanToDictionaryVector(segment, result, result_offset, start, scan_count);
	}
}